

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

void __thiscall
icu_63::CollationElementIterator::setText
          (CollationElementIterator *this,UnicodeString *source,UErrorCode *status)

{
  CollationData *pCVar1;
  UBool UVar2;
  UBool UVar3;
  int32_t iVar4;
  char16_t *s_00;
  FCDUTF16CollationIterator *pFVar5;
  FCDUTF16CollationIterator *local_b8;
  FCDUTF16CollationIterator *local_78;
  FCDUTF16CollationIterator *pFStack_30;
  UBool numeric;
  CollationIterator *newIter;
  UChar *s;
  UErrorCode *status_local;
  UnicodeString *source_local;
  CollationElementIterator *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    UnicodeString::operator=(&this->string_,source);
    s_00 = UnicodeString::getBuffer(&this->string_);
    UVar2 = CollationSettings::isNumeric(this->rbc_->settings);
    UVar3 = CollationSettings::dontCheckFCD(this->rbc_->settings);
    if (UVar3 == '\0') {
      pFVar5 = (FCDUTF16CollationIterator *)UMemory::operator_new((UMemory *)0x210,(size_t)source);
      local_b8 = (FCDUTF16CollationIterator *)0x0;
      if (pFVar5 != (FCDUTF16CollationIterator *)0x0) {
        pCVar1 = this->rbc_->data;
        iVar4 = UnicodeString::length(&this->string_);
        FCDUTF16CollationIterator::FCDUTF16CollationIterator
                  (pFVar5,pCVar1,UVar2,s_00,s_00,s_00 + iVar4);
        local_b8 = pFVar5;
      }
      pFStack_30 = local_b8;
    }
    else {
      pFVar5 = (FCDUTF16CollationIterator *)UMemory::operator_new((UMemory *)0x1a0,(size_t)source);
      local_78 = (FCDUTF16CollationIterator *)0x0;
      if (pFVar5 != (FCDUTF16CollationIterator *)0x0) {
        pCVar1 = this->rbc_->data;
        iVar4 = UnicodeString::length(&this->string_);
        UTF16CollationIterator::UTF16CollationIterator
                  ((UTF16CollationIterator *)pFVar5,pCVar1,UVar2,s_00,s_00,s_00 + iVar4);
        local_78 = pFVar5;
      }
      pFStack_30 = local_78;
    }
    if (pFStack_30 == (FCDUTF16CollationIterator *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      if (this->iter_ != (CollationIterator *)0x0) {
        (*(this->iter_->super_UObject)._vptr_UObject[1])();
      }
      this->iter_ = (CollationIterator *)pFStack_30;
      this->otherHalf_ = 0;
      this->dir_ = '\0';
    }
  }
  return;
}

Assistant:

void CollationElementIterator::setText(const UnicodeString& source,
                                       UErrorCode& status)
{
    if (U_FAILURE(status)) {
        return;
    }

    string_ = source;
    const UChar *s = string_.getBuffer();
    CollationIterator *newIter;
    UBool numeric = rbc_->settings->isNumeric();
    if (rbc_->settings->dontCheckFCD()) {
        newIter = new UTF16CollationIterator(rbc_->data, numeric, s, s, s + string_.length());
    } else {
        newIter = new FCDUTF16CollationIterator(rbc_->data, numeric, s, s, s + string_.length());
    }
    if (newIter == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    delete iter_;
    iter_ = newIter;
    otherHalf_ = 0;
    dir_ = 0;
}